

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  uint16_t uVar1;
  LYS_NODE LVar2;
  char *expr;
  int iVar3;
  lys_node *node_00;
  lys_module *plVar4;
  LY_ERR *pLVar5;
  byte bVar6;
  uint8_t *puVar7;
  undefined8 uVar8;
  char *unaff_R13;
  long lVar9;
  undefined1 auStack_78 [8];
  lyxp_set set;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x160e,"int resolve_must(struct lyd_node *, int, int)");
  }
  set.val._8_8_ = 0;
  set.used = 0;
  set.size = 0;
  set._8_8_ = 0;
  set.val.nodes = (lyxp_set_nodes *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  set.type = LYXP_SET_EMPTY;
  set._4_4_ = 0;
  node_00 = node->schema;
  if (inout_parent == 0) {
    LVar2 = node_00->nodetype;
    bVar6 = 0;
    if ((int)LVar2 < 0x10) {
      if (LVar2 == LYS_CONTAINER) {
        puVar7 = node_00->padding + 2;
        goto LAB_0011bcbd;
      }
      if ((LVar2 == LYS_LEAF) || (LVar2 == LYS_LEAFLIST)) goto LAB_0011bcb9;
    }
    else if ((int)LVar2 < 0x80) {
      if (LVar2 == LYS_LIST) {
        puVar7 = node_00->padding;
LAB_0011bcbd:
        bVar6 = *puVar7;
        goto LAB_0011bcbf;
      }
      if (LVar2 == LYS_ANYXML) goto LAB_0011bcb9;
    }
    else if ((LVar2 == LYS_NOTIF) || (LVar2 == LYS_ANYDATA)) {
LAB_0011bcb9:
      puVar7 = node_00->padding + 3;
      goto LAB_0011bcbd;
    }
LAB_0011bcc3:
    if (bVar6 != 0) {
      uVar1 = node_00->flags;
      lVar9 = 0;
      do {
        expr = *(char **)(unaff_R13 + lVar9);
        plVar4 = lyd_node_module(node);
        iVar3 = lyxp_eval(expr,node,LYXP_NODE_ELEM,plVar4,(lyxp_set *)auStack_78,1);
        if (iVar3 != 0) goto LAB_0011bc61;
        plVar4 = lyd_node_module(node);
        lyxp_set_cast((lyxp_set *)auStack_78,LYXP_SET_BOOLEAN,node,plVar4,1);
        if (set._8_4_ == 0) {
          if ((ignore_fail == 2 & (byte)(uVar1 >> 9) & 1) == 0 && ignore_fail != 1) {
            ly_vlog(LYE_NOMUST,LY_VLOG_LYD,node,*(undefined8 *)(unaff_R13 + lVar9));
            if (*(long *)(unaff_R13 + lVar9 + 0x20) != 0) {
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0);
            }
            if (*(long *)(unaff_R13 + lVar9 + 0x18) == 0) {
              return 1;
            }
            pLVar5 = ly_errno_location();
            strncpy((char *)(pLVar5 + 0x206),*(char **)(unaff_R13 + lVar9 + 0x18),0x7f);
            return 1;
          }
          if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Must condition \"%s\" not satisfied, but it is not required.",
                   *(undefined8 *)(unaff_R13 + lVar9));
          }
        }
        lVar9 = lVar9 + 0x38;
      } while ((ulong)bVar6 * 0x38 != lVar9);
    }
    iVar3 = 0;
  }
  else {
    do {
      node_00 = lys_parent(node_00);
      if (node_00 == (lys_node *)0x0) goto LAB_0011bc3a;
    } while ((node_00->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if ((node_00->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
LAB_0011bc3a:
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINT;
      uVar8 = 0x1616;
    }
    else {
      node = node->parent;
      if ((node->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        bVar6 = node_00->padding[3];
LAB_0011bcbf:
        unaff_R13 = node_00[1].dsc;
        goto LAB_0011bcc3;
      }
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINT;
      uVar8 = 0x1621;
    }
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c",
           uVar8);
LAB_0011bc61:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    int node_flags;
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT;
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        node_flags = schema->flags;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT;
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }

        node_flags = node->schema->flags;
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((node_flags & LYS_XPATH_DEP) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, must[i].emsg);
                }
                if (must[i].eapptag) {
                    strncpy(((struct ly_err *)&ly_errno)->apptag, must[i].eapptag, LY_APPTAG_LEN - 1);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}